

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

shared_ptr<chrono::ChLinkLockRevolute> __thiscall
chrono::curiosity::AddRevoluteJoint
          (curiosity *this,shared_ptr<chrono::ChBodyAuxRef> *body_1,
          shared_ptr<chrono::ChBodyAuxRef> *body_2,
          shared_ptr<chrono::curiosity::CuriosityChassis> *chassis,ChVector<double> *rel_joint_pos,
          ChQuaternion<double> *rel_joint_rot)

{
  long *plVar1;
  ChFrame<double> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chrono::ChLinkLockRevolute> sVar2;
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_198 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_188 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_178;
  double dStack_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             &(((chassis->
                super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr)->super_CuriosityPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  this_00 = (ChFrame<double> *)(**(code **)(*local_b8._vptr_ChFrame + 0x1f0))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
  ChFrame<double>::ChFrame(&local_b8,rel_joint_pos,rel_joint_rot);
  ChFrame<double>::operator*(&local_140,this_00,&local_b8);
  chrono_types::make_shared<chrono::ChLinkLockRevolute,_0>();
  plVar1 = *(long **)this;
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_188,&body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_198,&body_2->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
            );
  local_178._M_ptr = (element_type *)local_140.coord.pos.m_data[0];
  local_178._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140.coord.pos.m_data[1];
  dStack_168 = local_140.coord.pos.m_data[2];
  dStack_160 = local_140.coord.rot.m_data[0];
  local_158 = local_140.coord.rot.m_data[1];
  dStack_150 = local_140.coord.rot.m_data[2];
  local_148 = local_140.coord.rot.m_data[3];
  (**(code **)(*plVar1 + 0x250))(plVar1,local_188,local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_178,
             &(((chassis->
                super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr)->super_CuriosityPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  plVar1 = *(long **)(local_178._M_ptr + 0x38);
  std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLinkLockRevolute,void>
            (local_1a8,(__shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2> *)this)
  ;
  (**(code **)(*plVar1 + 0x138))(plVar1,local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
  sVar2.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkLockRevolute>)
         sVar2.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkLockRevolute> AddRevoluteJoint(std::shared_ptr<ChBodyAuxRef> body_1,
                                                     std::shared_ptr<ChBodyAuxRef> body_2,
                                                     std::shared_ptr<CuriosityChassis> chassis,
                                                     const ChVector<>& rel_joint_pos,
                                                     const ChQuaternion<>& rel_joint_rot) {
    const ChFrame<>& X_GP = chassis->GetBody()->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);                       // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                                       // global -> child

    auto joint = chrono_types::make_shared<ChLinkLockRevolute>();
    joint->Initialize(body_1, body_2, ChCoordsys<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    chassis->GetBody()->GetSystem()->AddLink(joint);

    return joint;
}